

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
               (interval_t *adata,date_t *bdata,interval_t *cdata,date_t *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_date_t_interval_t_date_t_interval_t *fun)

{
  ulong *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  unsigned_long *puVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  date_t dVar14;
  ulong uVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  ulong uVar17;
  ulong uVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  interval_t iVar20;
  interval_t iVar21;
  interval_t iVar22;
  interval_t iVar23;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  date_t *local_40;
  idx_t local_38;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar19 = 0;
      do {
        uVar15 = uVar19;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar15 = (ulong)asel->sel_vector[uVar19];
        }
        uVar17 = uVar19;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar17 = (ulong)bsel->sel_vector[uVar19];
        }
        uVar18 = uVar19;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar18 = (ulong)csel->sel_vector[uVar19];
        }
        uVar2 = adata[uVar15].months;
        uVar7 = adata[uVar15].days;
        iVar20.days = uVar7;
        iVar20.months = uVar2;
        uVar3 = cdata[uVar18].months;
        uVar8 = cdata[uVar18].days;
        iVar22.days = uVar8;
        iVar22.months = uVar3;
        iVar20.micros = adata[uVar15].micros;
        iVar22.micros = cdata[uVar18].micros;
        dVar14 = (*fun)(iVar20,bdata[uVar17].days,iVar22);
        result_data[uVar19].days = dVar14.days;
        uVar19 = uVar19 + 1;
      } while (count != uVar19);
    }
  }
  else if (count != 0) {
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar19 = 0;
    local_40 = bdata;
    do {
      uVar15 = uVar19;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)asel->sel_vector[uVar19];
      }
      uVar17 = uVar19;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar17 = (ulong)bsel->sel_vector[uVar19];
      }
      uVar18 = uVar19;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar18 = (ulong)csel->sel_vector[uVar19];
      }
      puVar6 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar6 == (unsigned_long *)0x0) || ((puVar6[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0))
          && ((puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0))
             )) && ((puVar6 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar6 == (unsigned_long *)0x0 ||
                    ((puVar6[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) {
        uVar4 = adata[uVar15].months;
        uVar9 = adata[uVar15].days;
        iVar21.days = uVar9;
        iVar21.months = uVar4;
        uVar5 = cdata[uVar18].months;
        uVar10 = cdata[uVar18].days;
        iVar23.days = uVar10;
        iVar23.months = uVar5;
        iVar21.micros = adata[uVar15].micros;
        iVar23.micros = cdata[uVar18].micros;
        dVar14 = (*fun)(iVar21,bdata[uVar17].days,iVar23);
        result_data[uVar19].days = dVar14.days;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var13 = p_Stack_50;
          peVar12 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar12;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var13;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          bdata = local_40;
        }
        bVar11 = (byte)uVar19 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar19 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
      }
      uVar19 = uVar19 + 1;
    } while (count != uVar19);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}